

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  UserData in_RCX;
  SUNMatrix in_RDX;
  UserData in_RDI;
  SUNMatrix in_XMM0_Qa;
  N_Vector unaff_retaddr;
  UserData udata;
  
  SUNMatZero(in_RDX);
  LaplaceMatrix(1.0,in_RDX,in_RCX);
  ReactionJac((sunrealtype)udata,unaff_retaddr,in_XMM0_Qa,in_RDI);
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data */
  SUNMatZero(J);                        /* Initialize Jacobian to zero */

  /* Fill in the Laplace matrix */
  LaplaceMatrix(SUN_RCONST(1.0), J, udata);

  /* Add in the Jacobian of the reaction terms matrix */
  ReactionJac(SUN_RCONST(1.0), y, J, udata);

  return 0; /* Return with success */
}